

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad4d_avx2.c
# Opt level: O3

void aom_sad16x4x3d_avx2(uint8_t *src,int src_stride,uint8_t **ref,int ref_stride,uint32_t *res)

{
  undefined1 auVar1 [16];
  int iVar2;
  bool bVar3;
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  bool bVar6;
  undefined1 (*pauVar7) [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  
  pauVar4 = (undefined1 (*) [16])*ref;
  pauVar7 = (undefined1 (*) [16])ref[1];
  pauVar5 = (undefined1 (*) [16])ref[2];
  iVar2 = ref_stride * 2;
  auVar8 = ZEXT1664((undefined1  [16])0x0);
  auVar9 = ZEXT1664((undefined1  [16])0x0);
  auVar10 = ZEXT1664((undefined1  [16])0x0);
  bVar3 = true;
  do {
    bVar6 = bVar3;
    auVar11._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])src + src_stride) +
         ZEXT116(1) * *(undefined1 (*) [16])src;
    auVar11._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])src + src_stride);
    auVar12._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])(*pauVar4 + ref_stride) + ZEXT116(1) * *pauVar4;
    auVar12._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) * *(undefined1 (*) [16])(*pauVar4 + ref_stride);
    auVar13._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])(*pauVar7 + ref_stride) + ZEXT116(1) * *pauVar7;
    auVar13._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) * *(undefined1 (*) [16])(*pauVar7 + ref_stride);
    auVar14._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])(*pauVar5 + ref_stride) + ZEXT116(1) * *pauVar5;
    auVar14._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) * *(undefined1 (*) [16])(*pauVar5 + ref_stride);
    auVar12 = vpsadbw_avx2(auVar12,auVar11);
    auVar12 = vpaddd_avx2(auVar8._0_32_,auVar12);
    auVar8 = ZEXT3264(auVar12);
    auVar13 = vpsadbw_avx2(auVar13,auVar11);
    auVar13 = vpaddd_avx2(auVar10._0_32_,auVar13);
    auVar10 = ZEXT3264(auVar13);
    auVar11 = vpsadbw_avx2(auVar14,auVar11);
    auVar11 = vpaddd_avx2(auVar9._0_32_,auVar11);
    auVar9 = ZEXT3264(auVar11);
    src = *(undefined1 (*) [16])src + src_stride * 2;
    pauVar4 = (undefined1 (*) [16])(*pauVar4 + iVar2);
    pauVar7 = (undefined1 (*) [16])(*pauVar7 + iVar2);
    pauVar5 = (undefined1 (*) [16])(*pauVar5 + iVar2);
    bVar3 = false;
  } while (bVar6);
  auVar12 = vshufps_avx(auVar12,auVar13,0x88);
  auVar13 = vshufps_avx(auVar11,ZEXT832(0) << 0x20,0xa8);
  auVar12 = vphaddd_avx2(auVar12,auVar13);
  auVar1 = vpaddd_avx(auVar12._16_16_,auVar12._0_16_);
  *(undefined1 (*) [16])res = auVar1;
  return;
}

Assistant:

static AOM_FORCE_INLINE void aom_sad16xNx3d_avx2(int N, const uint8_t *src,
                                                 int src_stride,
                                                 const uint8_t *const ref[4],
                                                 int ref_stride,
                                                 uint32_t res[4]) {
  __m256i src_reg, ref0_reg, ref1_reg, ref2_reg;
  __m256i sum_ref0, sum_ref1, sum_ref2;
  const uint8_t *ref0, *ref1, *ref2;
  const __m256i zero = _mm256_setzero_si256();
  assert(N % 2 == 0);

  ref0 = ref[0];
  ref1 = ref[1];
  ref2 = ref[2];
  sum_ref0 = _mm256_setzero_si256();
  sum_ref2 = _mm256_setzero_si256();
  sum_ref1 = _mm256_setzero_si256();

  for (int i = 0; i < N; i += 2) {
    // load src and all refs
    src_reg = yy_loadu2_128(src + src_stride, src);
    ref0_reg = yy_loadu2_128(ref0 + ref_stride, ref0);
    ref1_reg = yy_loadu2_128(ref1 + ref_stride, ref1);
    ref2_reg = yy_loadu2_128(ref2 + ref_stride, ref2);

    // sum of the absolute differences between every ref-i to src
    ref0_reg = _mm256_sad_epu8(ref0_reg, src_reg);
    ref1_reg = _mm256_sad_epu8(ref1_reg, src_reg);
    ref2_reg = _mm256_sad_epu8(ref2_reg, src_reg);

    // sum every ref-i
    sum_ref0 = _mm256_add_epi32(sum_ref0, ref0_reg);
    sum_ref1 = _mm256_add_epi32(sum_ref1, ref1_reg);
    sum_ref2 = _mm256_add_epi32(sum_ref2, ref2_reg);

    src += 2 * src_stride;
    ref0 += 2 * ref_stride;
    ref1 += 2 * ref_stride;
    ref2 += 2 * ref_stride;
  }

  aggregate_and_store_sum(res, &sum_ref0, &sum_ref1, &sum_ref2, &zero);
}